

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerUnaryHelperMemWithBoolReference
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool useBoolForBailout)

{
  StackSym *pSVar1;
  RegOpnd *dst;
  Instr *pIVar2;
  SymOpnd *local_50;
  RegOpnd *boolRefOpnd;
  SymOpnd *boolOpnd;
  bool useBoolForBailout_local;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (this->m_func->tempSymBool == (StackSym *)0x0) {
    pSVar1 = StackSym::New(TyUint8,this->m_func);
    this->m_func->tempSymBool = pSVar1;
    Func::StackAllocate(this->m_func,this->m_func->tempSymBool,1);
  }
  local_50 = IR::SymOpnd::New(&this->m_func->tempSymBool->super_Sym,TyUint8,this->m_func);
  dst = IR::RegOpnd::New(TyInt64,this->m_func);
  InsertLea(dst,&local_50->super_Opnd,instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&dst->super_Opnd);
  if (!useBoolForBailout) {
    local_50 = (SymOpnd *)0x0;
  }
  pIVar2 = LowerUnaryHelperMem(this,instr,helperMethod,&local_50->super_Opnd);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerUnaryHelperMemWithBoolReference(IR::Instr *instr, IR::JnHelperMethod helperMethod, bool useBoolForBailout)
{
    if (!this->m_func->tempSymBool)
    {
        this->m_func->tempSymBool = StackSym::New(TyUint8, this->m_func);
        this->m_func->StackAllocate(this->m_func->tempSymBool, TySize[TyUint8]);
    }
    IR::SymOpnd * boolOpnd = IR::SymOpnd::New(this->m_func->tempSymBool, TyUint8, this->m_func);
    IR::RegOpnd * boolRefOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
    InsertLea(boolRefOpnd, boolOpnd, instr);

    m_lowererMD.LoadHelperArgument(instr, boolRefOpnd);

    return this->LowerUnaryHelperMem(instr, helperMethod, useBoolForBailout ? boolOpnd : nullptr);
}